

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O2

List<Callback::Listener::Signal> * __thiscall
List<Callback::Listener::Signal>::operator=
          (List<Callback::Listener::Signal> *this,List<Callback::Listener::Signal> *other)

{
  Item *value;
  Iterator *pIVar1;
  
  clear(this);
  pIVar1 = &other->_begin;
  while (value = pIVar1->item, value != &other->endItem) {
    append(this,&value->value);
    pIVar1 = (Iterator *)&value->next;
  }
  return this;
}

Assistant:

List& operator=(const List& other)
  {
    clear();
    for(const Item* i = other._begin.item, * end = &other.endItem; i != end; i = i->next)
      append(i->value);
    return *this;
  }